

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O3

void daxpy(int n,double da,double *dx,int incx,double *dy,int incy)

{
  uint uVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  
  if ((0 < n) && ((da != 0.0 || (NAN(da))))) {
    if (incy != 1 || incx != 1) {
      pdVar4 = dx + (incx >> 0x1f & (1 - n) * incx);
      pdVar3 = dy + (incy >> 0x1f & (1 - n) * incy);
      do {
        *pdVar3 = *pdVar4 * da + *pdVar3;
        pdVar4 = pdVar4 + incx;
        pdVar3 = pdVar3 + incy;
        n = n + -1;
      } while (n != 0);
      return;
    }
    uVar1 = n & 3;
    uVar2 = (ulong)uVar1;
    if (uVar1 != 0) {
      uVar5 = 0;
      do {
        dy[uVar5] = dx[uVar5] * da + dy[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    if (3 < n) {
      do {
        dy[uVar2] = dx[uVar2] * da + dy[uVar2];
        dy[uVar2 + 1] = dx[uVar2 + 1] * da + dy[uVar2 + 1];
        dy[uVar2 + 2] = dx[uVar2 + 2] * da + dy[uVar2 + 2];
        dy[uVar2 + 3] = dx[uVar2 + 3] * da + dy[uVar2 + 3];
        uVar2 = uVar2 + 4;
      } while (uVar2 < (uint)n);
    }
  }
  return;
}

Assistant:

void daxpy ( int n, double da, double dx[], int incx, double dy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DAXPY computes constant times a vector plus a vector.
//
//  Discussion:
//
//    This routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in DX and DY.
//
//    Input, double DA, the multiplier of DX.
//
//    Input, double DX[*], the first vector.
//
//    Input, int INCX, the increment between successive entries of DX.
//
//    Input/output, double DY[*], the second vector.
//    On output, DY[*] has been replaced by DY[*] + DA * DX[*].
//
//    Input, int INCY, the increment between successive entries of DY.
//
{
  int i;
  int ix;
  int iy;
  int m;

  if ( n <= 0 )
  {
    return;
  }

  if ( da == 0.0 )
  {
    return;
  }
//
//  Code for unequal increments or equal increments
//  not equal to 1.
//
  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      dy[iy] = dy[iy] + da * dx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
//
//  Code for both increments equal to 1.
//
  else
  {
    m = n % 4;

    for ( i = 0; i < m; i++ )
    {
      dy[i] = dy[i] + da * dx[i];
    }

    for ( i = m; i < n; i = i + 4 )
    {
      dy[i  ] = dy[i  ] + da * dx[i  ];
      dy[i+1] = dy[i+1] + da * dx[i+1];
      dy[i+2] = dy[i+2] + da * dx[i+2];
      dy[i+3] = dy[i+3] + da * dx[i+3];
    }

  }

  return;
}